

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b3D_integrator.cpp
# Opt level: O0

void __thiscall
NetworkNS::cb3D_integrator::report
          (cb3D_integrator *this,uint istep,double b_energy,double nb_energy)

{
  clock_t cVar1;
  ostream *poVar2;
  size_type sVar3;
  double dVar4;
  double inv_vol;
  clock_t tend;
  double press_tens [6];
  double nb_energy_local;
  double b_energy_local;
  uint istep_local;
  cb3D_integrator *this_local;
  
  press_tens[5] = nb_energy;
  cVar1 = clock();
  calculate_pressure(this,(double *)&tend);
  dVar4 = 1.0 / (this->cur_bd_net->domain->XBoxLen * this->cur_bd_net->domain->YBoxLen *
                this->cur_bd_net->domain->ZBoxLen);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,istep);
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,b_energy);
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,press_tens[5]);
  poVar2 = std::operator<<(poVar2,"\t");
  sVar3 = std::__cxx11::list<sStrand_*,_std::allocator<sStrand_*>_>::size
                    (&this->cur_bd_net->network->pslip_springs);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)tend * dVar4);
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,press_tens[0] * dVar4);
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,press_tens[1] * dVar4);
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,press_tens[2] * dVar4);
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,press_tens[3] * dVar4);
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,press_tens[4] * dVar4);
  poVar2 = std::operator<<(poVar2,"\t");
  poVar2 = std::operator<<(poVar2," # (");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)(cVar1 - this->tbegin) / 1000000.0);
  poVar2 = std::operator<<(poVar2,"s )");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void cb3D_integrator::report(unsigned int istep, double b_energy, double nb_energy){

      double press_tens[6];

      // gvog: Ask for the current time:
      clock_t tend = clock();
      calculate_pressure(press_tens);

      double inv_vol = 1.0 / (  cur_bd_net->domain->XBoxLen
                              * cur_bd_net->domain->YBoxLen
                              * cur_bd_net->domain->ZBoxLen);
      
      cout << istep << "\t" << b_energy << "\t" << nb_energy << "\t"
              << cur_bd_net->network->pslip_springs.size() << "\t" 
              //<< pressure      * inv_vol << "\t" 
              << press_tens[0] * inv_vol << "\t"
              << press_tens[1] * inv_vol << "\t"
              << press_tens[2] * inv_vol << "\t"
              << press_tens[3] * inv_vol << "\t" 
              << press_tens[4] * inv_vol << "\t" 
              << press_tens[5] * inv_vol << "\t"
              << " # (" << (double) (tend - tbegin) / CLOCKS_PER_SEC << "s )" << endl;

      //cur_bd_net->my_traj_file->add_snapshot_to_dump(cur_bd_net, this, istep);

      return;
   }